

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::CodeGeneratorTest_GetResolvedSourceFeaturesRoot_Test::
TestBody(CodeGeneratorTest_GetResolvedSourceFeaturesRoot_Test *this)

{
  allocator<const_google::protobuf::FieldDescriptor_*> *this_00;
  initializer_list<const_google::protobuf::FieldDescriptor_*> __l;
  bool bVar1;
  FeatureSetDefaults *pFVar2;
  Message *message;
  char *pcVar3;
  Descriptor *pDVar4;
  FileDescriptor *pFVar5;
  FeatureSet *this_01;
  char *in_R9;
  AssertHelper local_3e8;
  Message local_3e0;
  EnumFeature local_3d8;
  EnumFeature local_3d4;
  undefined1 local_3d0 [8];
  AssertionResult gtest_ar_7;
  Message local_3b8;
  EnumFeature local_3b0;
  EnumFeature local_3ac;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar_6;
  Message local_390;
  EnumFeature local_388;
  EnumFeature local_384;
  undefined1 local_380 [8];
  AssertionResult gtest_ar_5;
  Message local_368;
  FeatureSet_EnumType local_35c;
  undefined1 local_358 [8];
  AssertionResult gtest_ar_4;
  Message local_340;
  FeatureSet_FieldPresence local_334;
  undefined1 local_330 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_300;
  Message local_2f8;
  FeatureSet_FieldPresence local_2ec;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_2b8;
  Message local_2b0;
  bool local_2a1;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar__1;
  TestFeatures *ext;
  FeatureSet *features;
  Message local_278;
  char local_269;
  undefined1 local_268 [8];
  AssertionResult gtest_ar_2;
  FileDescriptor *file;
  Message local_238;
  FileDescriptor *local_230;
  char local_221;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_1;
  Message local_208;
  FileDescriptor *local_200;
  char local_1f1;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar;
  string local_1d8;
  AssertHelper local_1b8;
  StatusOr<google::protobuf::FeatureSetDefaults> local_1b0;
  FeatureSetDefaults local_170;
  undefined1 local_138 [8];
  string_view local_130;
  Message local_120;
  StatusOr<google::protobuf::FeatureSetDefaults> local_118;
  FeatureSetDefaults local_d8;
  undefined1 local_a0 [15];
  bool local_91;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_;
  __uniq_ptr_impl<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
  local_70;
  __uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
  local_68;
  size_type local_60;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_58;
  undefined1 local_40 [8];
  TestGenerator generator;
  CodeGeneratorTest_GetResolvedSourceFeaturesRoot_Test *this_local;
  
  generator.feature_extensions_.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  TestGenerator::TestGenerator((TestGenerator *)local_40);
  local_70._M_t.
  super__Tuple_impl<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
  .
  super__Head_base<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_false>
  ._M_head_impl =
       (tuple<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
        )GetExtensionReflection<google::protobuf::FeatureSet,google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,(unsigned_char)11,false,google::protobuf::DescriptorPool>
                   ((ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                     *)pb::test);
  local_68._M_t.
  super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
  .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>._M_head_impl =
       (tuple<google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
        )&local_70;
  local_60 = 1;
  this_00 = (allocator<const_google::protobuf::FieldDescriptor_*> *)
            ((long)&gtest_ar_.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            + 3);
  std::allocator<const_google::protobuf::FieldDescriptor_*>::allocator(this_00);
  __l._M_len = local_60;
  __l._M_array = (iterator)
                 local_68._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                 .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                 _M_head_impl;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector(&local_58,__l,this_00);
  TestGenerator::set_feature_extensions((TestGenerator *)local_40,&local_58);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector(&local_58);
  std::allocator<const_google::protobuf::FieldDescriptor_*>::~allocator
            ((allocator<const_google::protobuf::FieldDescriptor_*> *)
             ((long)&gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 3));
  CodeGenerator::BuildFeatureSetDefaults(&local_118,(CodeGenerator *)local_40);
  pFVar2 = absl::lts_20250127::StatusOr<google::protobuf::FeatureSetDefaults>::operator*(&local_118)
  ;
  FeatureSetDefaults::FeatureSetDefaults(&local_d8,pFVar2);
  DescriptorPool::SetFeatureSetDefaults
            ((DescriptorPool *)local_a0,(FeatureSetDefaults *)&(this->super_CodeGeneratorTest).pool_
            );
  local_91 = absl::lts_20250127::Status::ok((Status *)local_a0);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_90,&local_91,(type *)0x0)
  ;
  absl::lts_20250127::Status::~Status((Status *)local_a0);
  FeatureSetDefaults::~FeatureSetDefaults(&local_d8);
  absl::lts_20250127::StatusOr<google::protobuf::FeatureSetDefaults>::~StatusOr(&local_118);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    CodeGenerator::BuildFeatureSetDefaults(&local_1b0,(CodeGenerator *)local_40);
    pFVar2 = absl::lts_20250127::StatusOr<google::protobuf::FeatureSetDefaults>::operator*
                       (&local_1b0);
    FeatureSetDefaults::FeatureSetDefaults(&local_170,pFVar2);
    DescriptorPool::SetFeatureSetDefaults
              ((DescriptorPool *)local_138,
               (FeatureSetDefaults *)&(this->super_CodeGeneratorTest).pool_);
    local_130 = absl::lts_20250127::Status::message((Status *)local_138);
    message = testing::Message::operator<<(&local_120,&local_130);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1d8,(internal *)local_90,
               (AssertionResult *)
               "pool_.SetFeatureSetDefaults(*generator.BuildFeatureSetDefaults()).ok()","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/code_generator_unittest.cc"
               ,0xae,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1b8,message);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    std::__cxx11::string::~string((string *)&local_1d8);
    absl::lts_20250127::Status::~Status((Status *)local_138);
    FeatureSetDefaults::~FeatureSetDefaults(&local_170);
    absl::lts_20250127::StatusOr<google::protobuf::FeatureSetDefaults>::~StatusOr(&local_1b0);
    testing::Message::~Message(&local_120);
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  if (gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    testing::NotNull();
    testing::internal::
    MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::NotNullMatcher>>
              ();
    pDVar4 = DescriptorProto::descriptor();
    pFVar5 = Descriptor::file(pDVar4);
    local_200 = CodeGeneratorTest::BuildFile(&this->super_CodeGeneratorTest,pFVar5);
    testing::internal::
    PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::NotNullMatcher>>::
    operator()(local_1f0,&local_1f1,
               (FileDescriptor **)"BuildFile(DescriptorProto::descriptor()->file())");
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
    if (!bVar1) {
      testing::Message::Message(&local_208);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/code_generator_unittest.cc"
                 ,0xb0,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_208);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_208);
    }
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
    if (gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      testing::NotNull();
      testing::internal::
      MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::NotNullMatcher>>
                ();
      pDVar4 = pb::TestMessage::descriptor();
      pFVar5 = Descriptor::file(pDVar4);
      local_230 = CodeGeneratorTest::BuildFile(&this->super_CodeGeneratorTest,pFVar5);
      testing::internal::
      PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::NotNullMatcher>>
      ::operator()(local_220,&local_221,
                   (FileDescriptor **)"BuildFile(pb::TestMessage::descriptor()->file())");
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
      if (!bVar1) {
        testing::Message::Message(&local_238);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&file,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/code_generator_unittest.cc"
                   ,0xb1,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&file,&local_238);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&file);
        testing::Message::~Message(&local_238);
      }
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
      if (gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_2.message_,
                   "\n    edition = \"2023\";\n    package proto2_unittest;\n\n    import \"google/protobuf/unittest_features.proto\";\n\n    option features.field_presence = EXPLICIT;  // 2023 default\n    option features.enum_type = CLOSED;         // override\n    option features.(pb.test).file_feature = VALUE6;\n    option features.(pb.test).source_feature = VALUE5;\n  "
                  );
        pFVar5 = CodeGeneratorTest::BuildFile
                           (&this->super_CodeGeneratorTest,stack0xfffffffffffffda8);
        testing::NotNull();
        testing::internal::
        MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::NotNullMatcher>>
                  ();
        testing::internal::
        PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::NotNullMatcher>>
        ::operator()(local_268,&local_269,(FileDescriptor **)0x1eed29c);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
        if (!bVar1) {
          testing::Message::Message(&local_278);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&features,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/code_generator_unittest.cc"
                     ,0xbd,pcVar3);
          testing::internal::AssertHelper::operator=((AssertHelper *)&features,&local_278);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&features);
          testing::Message::~Message(&local_278);
        }
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
        if (gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          this_01 = CodeGenerator::GetResolvedSourceFeatures<google::protobuf::FileDescriptor>
                              (pFVar5);
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )FeatureSet::
                 GetExtension<google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false,_0>
                           (this_01,(ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                                     *)pb::test);
          local_2a1 = FeatureSet::has_repeated_field_encoding(this_01);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_2a0,&local_2a1,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
          if (!bVar1) {
            testing::Message::Message(&local_2b0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__2.message_,(internal *)local_2a0,
                       (AssertionResult *)"features.has_repeated_field_encoding()","false","true",
                       in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_2b8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/code_generator_unittest.cc"
                       ,0xc2,pcVar3);
            testing::internal::AssertHelper::operator=(&local_2b8,&local_2b0);
            testing::internal::AssertHelper::~AssertHelper(&local_2b8);
            std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
            testing::Message::~Message(&local_2b0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
          local_2ec = FeatureSet::field_presence(this_01);
          testing::AssertionResult::AssertionResult<google::protobuf::FeatureSet_FieldPresence>
                    ((AssertionResult *)local_2e8,&local_2ec,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
          if (!bVar1) {
            testing::Message::Message(&local_2f8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_3.message_,(internal *)local_2e8,
                       (AssertionResult *)"features.field_presence()","false","true",in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_300,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/code_generator_unittest.cc"
                       ,0xc3,pcVar3);
            testing::internal::AssertHelper::operator=(&local_300,&local_2f8);
            testing::internal::AssertHelper::~AssertHelper(&local_300);
            std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
            testing::Message::~Message(&local_2f8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
          local_334 = FeatureSet::field_presence(this_01);
          testing::internal::EqHelper::
          Compare<google::protobuf::FeatureSet_FieldPresence,_google::protobuf::FeatureSet_FieldPresence,_nullptr>
                    ((EqHelper *)local_330,"features.field_presence()","FeatureSet::EXPLICIT",
                     &local_334,&FeatureSet::EXPLICIT);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
          if (!bVar1) {
            testing::Message::Message(&local_340);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_330);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/code_generator_unittest.cc"
                       ,0xc4,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_4.message_,&local_340);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
            testing::Message::~Message(&local_340);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
          local_35c = FeatureSet::enum_type(this_01);
          testing::internal::EqHelper::
          Compare<google::protobuf::FeatureSet_EnumType,_google::protobuf::FeatureSet_EnumType,_nullptr>
                    ((EqHelper *)local_358,"features.enum_type()","FeatureSet::CLOSED",&local_35c,
                     &FeatureSet::CLOSED);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_358);
          if (!bVar1) {
            testing::Message::Message(&local_368);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_358);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/code_generator_unittest.cc"
                       ,0xc5,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_5.message_,&local_368);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
            testing::Message::~Message(&local_368);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
          local_384 = pb::TestFeatures::file_feature
                                ((TestFeatures *)
                                 gtest_ar__1.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl);
          local_388 = VALUE6;
          testing::internal::EqHelper::Compare<pb::EnumFeature,_pb::EnumFeature,_nullptr>
                    ((EqHelper *)local_380,"ext.file_feature()","pb::EnumFeature::VALUE6",&local_384
                     ,&local_388);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
          if (!bVar1) {
            testing::Message::Message(&local_390);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_380);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/code_generator_unittest.cc"
                       ,199,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_6.message_,&local_390);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
            testing::Message::~Message(&local_390);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
          local_3ac = pb::TestFeatures::source_feature
                                ((TestFeatures *)
                                 gtest_ar__1.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl);
          local_3b0 = VALUE5;
          testing::internal::EqHelper::Compare<pb::EnumFeature,_pb::EnumFeature,_nullptr>
                    ((EqHelper *)local_3a8,"ext.source_feature()","pb::EnumFeature::VALUE5",
                     &local_3ac,&local_3b0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a8);
          if (!bVar1) {
            testing::Message::Message(&local_3b8);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3a8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/code_generator_unittest.cc"
                       ,200,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_7.message_,&local_3b8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
            testing::Message::~Message(&local_3b8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
          local_3d4 = pb::TestFeatures::field_feature
                                ((TestFeatures *)
                                 gtest_ar__1.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl);
          local_3d8 = VALUE1;
          testing::internal::EqHelper::Compare<pb::EnumFeature,_pb::EnumFeature,_nullptr>
                    ((EqHelper *)local_3d0,"ext.field_feature()","pb::EnumFeature::VALUE1",
                     &local_3d4,&local_3d8);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d0);
          if (!bVar1) {
            testing::Message::Message(&local_3e0);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3d0);
            testing::internal::AssertHelper::AssertHelper
                      (&local_3e8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/code_generator_unittest.cc"
                       ,0xc9,pcVar3);
            testing::internal::AssertHelper::operator=(&local_3e8,&local_3e0);
            testing::internal::AssertHelper::~AssertHelper(&local_3e8);
            testing::Message::~Message(&local_3e0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d0);
          gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ = 0;
        }
      }
    }
  }
  TestGenerator::~TestGenerator((TestGenerator *)local_40);
  return;
}

Assistant:

TEST_F(CodeGeneratorTest, GetResolvedSourceFeaturesRoot) {
  TestGenerator generator;
  generator.set_feature_extensions({GetExtensionReflection(pb::test)});
  ASSERT_OK(pool_.SetFeatureSetDefaults(*generator.BuildFeatureSetDefaults()));

  ASSERT_THAT(BuildFile(DescriptorProto::descriptor()->file()), NotNull());
  ASSERT_THAT(BuildFile(pb::TestMessage::descriptor()->file()), NotNull());
  auto file = BuildFile(R"schema(
    edition = "2023";
    package proto2_unittest;

    import "google/protobuf/unittest_features.proto";

    option features.field_presence = EXPLICIT;  // 2023 default
    option features.enum_type = CLOSED;         // override
    option features.(pb.test).file_feature = VALUE6;
    option features.(pb.test).source_feature = VALUE5;
  )schema");
  ASSERT_THAT(file, NotNull());

  const FeatureSet& features = TestGenerator::GetResolvedSourceFeatures(*file);
  const pb::TestFeatures& ext = features.GetExtension(pb::test);

  EXPECT_TRUE(features.has_repeated_field_encoding());
  EXPECT_TRUE(features.field_presence());
  EXPECT_EQ(features.field_presence(), FeatureSet::EXPLICIT);
  EXPECT_EQ(features.enum_type(), FeatureSet::CLOSED);

  EXPECT_EQ(ext.file_feature(), pb::EnumFeature::VALUE6);
  EXPECT_EQ(ext.source_feature(), pb::EnumFeature::VALUE5);
  EXPECT_EQ(ext.field_feature(), pb::EnumFeature::VALUE1);
}